

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O1

void test_binary_frame_within_text_fragments(void)

{
  anon_struct_4_7_799a2f31_for_ws_flags *paVar1;
  int iVar2;
  cio_websocket *websocket;
  cio_error cVar3;
  uint uVar4;
  long lVar5;
  char data [12];
  undefined8 local_d8;
  undefined4 local_d0;
  ws_frame local_c8;
  undefined8 local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined2 local_90;
  undefined8 local_88;
  undefined1 *local_80;
  undefined8 local_78;
  undefined2 local_70;
  undefined8 local_68;
  undefined1 *local_60;
  undefined8 local_58;
  undefined2 local_50;
  undefined4 local_48;
  undefined8 local_44;
  undefined8 uStack_3c;
  undefined4 local_34;
  undefined2 local_30;
  
  local_c8.data = &local_d8;
  local_a0 = (undefined1 *)&local_d8;
  local_80 = (undefined1 *)&local_d8;
  local_60 = (undefined1 *)&local_d8;
  local_d8 = 0x6161616161616161;
  local_d0 = 0x61616161;
  local_c8.frame_type = CIO_WEBSOCKET_TEXT_FRAME;
  local_c8.direction = FROM_CLIENT;
  local_c8.data_length = 0xc;
  local_c8.last_frame = false;
  local_c8.rsv = false;
  local_a8 = 0;
  local_98 = 0xc;
  local_90 = 0;
  local_88 = 2;
  local_78 = 0xc;
  local_70 = 1;
  local_68 = 0;
  local_58 = 0xc;
  local_50 = 1;
  local_48 = 8;
  local_44 = 0;
  uStack_3c = 0;
  local_34 = 0;
  local_30 = 1;
  serialize_frames(&local_c8,5);
  websocket = ws;
  paVar1 = &(ws->ws_private).ws_flags;
  *(ushort *)paVar1 = *(ushort *)paVar1 | 0x400;
  cVar3 = cio_websocket_read_message(websocket,read_handler,(void *)0x0);
  UnityAssertEqualNumber
            (0,(long)cVar3,"Could not start reading a message!",0x6c6,UNITY_DISPLAY_STYLE_INT);
  UnityAssertGreaterOrLessOrEqualNumber
            (3,(ulong)read_handler_fake.call_count,UNITY_GREATER_OR_EQUAL,
             "number of read_handler callbacks called not correct",0x6c8,UNITY_DISPLAY_STYLE_INT);
  uVar4 = read_handler_fake.call_count - 1;
  if (uVar4 != 0) {
    lVar5 = 0x92f;
    do {
      UnityAssertEqualNumber
                ((UNITY_INT)ws,*(UNITY_INT *)&(&fde_table_entry_0011271c)[lVar5].data_loc,
                 "websocket parameter of read_handler not correct",0x6cb,UNITY_DISPLAY_STYLE_HEX64);
      if (*(long *)&(&fde_table_entry_001128b4)[lVar5].data_loc != 0) {
        UnityFail("context parameter of read_handler not correct",0x6cc);
      }
      UnityAssertEqualNumber
                (0,(long)*(int *)(BYTE_ARRAY_00114ed1 + lVar5 * 4 + 0x37),
                 "err parameter of read_handler not correct",0x6cd,UNITY_DISPLAY_STYLE_INT);
      if (*(long *)&(&fde_table_entry_00112cb4)[lVar5].data_loc == 0) {
        UnityFail("data parameter of read_handler not correct",0x6ce);
      }
      UnityAssertEqualNumber
                (0xc,*(UNITY_INT *)(&fde_00112e50 + lVar5 * 2),
                 "length parameter of read_handler not correct",0x6cf,UNITY_DISPLAY_STYLE_INT);
      if (*(char *)((long)&PTR_bcmp_00117058 + lVar5 + 5) == '\x01') {
        UnityFail("last_frame parameter of read_handler not correct",0x6d0);
      }
      if (*(char *)((long)read_handler_fake.arg0_history + lVar5 + -8) == '\x01') {
        UnityFail("is_binary parameter of read_handler not correct",0x6d1);
      }
      uVar4 = read_handler_fake.call_count - 1;
      iVar2 = (int)lVar5;
      lVar5 = lVar5 + 1;
    } while (iVar2 - 0x92eU < uVar4);
  }
  UnityAssertEqualNumber
            ((UNITY_INT)ws,(UNITY_INT)read_handler_fake.arg0_history[uVar4],
             "websocket parameter of read_handler not correct",0x6d4,UNITY_DISPLAY_STYLE_HEX64);
  if (read_handler_fake.arg1_history[read_handler_fake.call_count - 1] == (void *)0x0) {
    UnityAssertEqualNumber
              (1,(long)read_handler_fake.arg2_history[read_handler_fake.call_count - 1],
               "err parameter of read_handler not correct",0x6d6,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (1,(ulong)on_error_fake.call_count,"error callback was not called",0x6d8,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (0,(ulong)on_control_fake.call_count,"control callback was called for close frame",
               0x6da,UNITY_DISPLAY_STYLE_INT);
    return;
  }
  UnityFail("context parameter of read_handler not correct",0x6d5);
}

Assistant:

static void test_binary_frame_within_text_fragments(void)
{
	char data[12];
	memset(data, 'a', sizeof(data));

	struct ws_frame frames[] = {
	    {.frame_type = CIO_WEBSOCKET_TEXT_FRAME, .direction = FROM_CLIENT, .data = data, .data_length = sizeof(data), .last_frame = false, .rsv = false},
	    {.frame_type = CIO_WEBSOCKET_CONTINUATION_FRAME, .direction = FROM_CLIENT, .data = data, .data_length = sizeof(data), .last_frame = false, .rsv = false},
	    {.frame_type = CIO_WEBSOCKET_BINARY_FRAME, .direction = FROM_CLIENT, .data = data, .data_length = sizeof(data), .last_frame = true, .rsv = false},
	    {.frame_type = CIO_WEBSOCKET_CONTINUATION_FRAME, .direction = FROM_CLIENT, .data = data, .data_length = sizeof(data), .last_frame = true, .rsv = false},
	    {.frame_type = CIO_WEBSOCKET_CLOSE_FRAME, .direction = FROM_CLIENT, .data = NULL, .data_length = 0, .last_frame = true, .rsv = false},
	};

	serialize_frames(frames, ARRAY_SIZE(frames));

	ws->ws_private.ws_flags.is_server = (frames[0].direction == FROM_CLIENT) ? 1 : 0;
	enum cio_error err = cio_websocket_read_message(ws, read_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Could not start reading a message!");

	TEST_ASSERT_GREATER_OR_EQUAL_MESSAGE(3, read_handler_fake.call_count, "number of read_handler callbacks called not correct");

	for (unsigned int i = 0; i < read_handler_fake.call_count - 1; i++) {
		TEST_ASSERT_EQUAL_PTR_MESSAGE(ws, read_handler_fake.arg0_history[i], "websocket parameter of read_handler not correct");
		TEST_ASSERT_NULL_MESSAGE(read_handler_fake.arg1_history[i], "context parameter of read_handler not correct");
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, read_handler_fake.arg2_history[i], "err parameter of read_handler not correct");
		TEST_ASSERT_NOT_NULL_MESSAGE(read_handler_fake.arg4_history[i], "data parameter of read_handler not correct");
		TEST_ASSERT_EQUAL_MESSAGE(sizeof(data), read_handler_fake.arg5_history[i], "length parameter of read_handler not correct");
		TEST_ASSERT_FALSE_MESSAGE(read_handler_fake.arg7_history[i], "last_frame parameter of read_handler not correct");
		TEST_ASSERT_FALSE_MESSAGE(read_handler_fake.arg8_history[i], "is_binary parameter of read_handler not correct");
	}

	TEST_ASSERT_EQUAL_PTR_MESSAGE(ws, read_handler_fake.arg0_history[read_handler_fake.call_count - 1], "websocket parameter of read_handler not correct");
	TEST_ASSERT_NULL_MESSAGE(read_handler_fake.arg1_history[read_handler_fake.call_count - 1], "context parameter of read_handler not correct");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_EOF, read_handler_fake.arg2_history[read_handler_fake.call_count - 1], "err parameter of read_handler not correct");

	TEST_ASSERT_EQUAL_MESSAGE(1, on_error_fake.call_count, "error callback was not called");

	TEST_ASSERT_EQUAL_MESSAGE(0, on_control_fake.call_count, "control callback was called for close frame");
}